

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCommandBuffersTests.cpp
# Opt level: O2

TestStatus *
vkt::api::anon_unknown_0::renderPassContinueTest
          (TestStatus *__return_storage_ptr__,Context *context)

{
  uint *puVar1;
  byte bVar2;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data_00;
  Allocator *pAVar3;
  VkCommandBuffer apVVar4 [1];
  VkAllocationCallbacks *pVVar5;
  deUint32 dVar6;
  VkResult VVar7;
  int iVar8;
  DeviceInterface *pDVar9;
  VkDevice pVVar10;
  DeviceInterface *pDVar11;
  TextureLevel *this;
  byte *pbVar12;
  long lVar13;
  VkCommandBufferUsageFlags VVar14;
  byte *pbVar15;
  long lVar16;
  ulong size;
  undefined8 in_stack_fffffffffffffcb8;
  undefined4 in_stack_fffffffffffffcc0;
  undefined4 in_stack_fffffffffffffcc4;
  VkBufferImageCopy copyRegion;
  VkRenderPassCreateInfo renderPassCreateInfo;
  VkCommandBuffer secondaryCommandBuffer;
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> bufferAlloc;
  PixelBufferAccess pixelBufferAccess;
  VkAttachmentReference colorAttRef;
  MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> result;
  CommandBufferRenderPassTestEnvironment env;
  TextureFormat tcuFormat;
  undefined1 local_c8 [8];
  DeviceInterface *pDStack_c0;
  VkDevice local_b8;
  VkAllocationCallbacks *pVStack_b0;
  VkImageView attachmentViews [1];
  VkClearAttachment clearAttachment;
  VkClearRect clearRect;
  TextureFormat local_38;
  
  pDVar9 = Context::getDeviceInterface(context);
  env.super_CommandBufferBareTestEnvironment<1U>.m_context = context;
  pVVar10 = Context::getDevice(context);
  env.super_CommandBufferBareTestEnvironment<1U>.m_device = pVVar10;
  pDVar11 = Context::getDeviceInterface(context);
  env.super_CommandBufferBareTestEnvironment<1U>.m_vkd = pDVar11;
  env.super_CommandBufferBareTestEnvironment<1U>.m_queue = Context::getUniversalQueue(context);
  dVar6 = Context::getUniversalQueueFamilyIndex(context);
  env.super_CommandBufferBareTestEnvironment<1U>.m_queueFamilyIndex = dVar6;
  env.super_CommandBufferBareTestEnvironment<1U>.m_allocator = Context::getDefaultAllocator(context)
  ;
  env.super_CommandBufferBareTestEnvironment<1U>.m_commandPool.
  super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal = 0;
  env.super_CommandBufferBareTestEnvironment<1U>.m_commandPool.
  super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  env.super_CommandBufferBareTestEnvironment<1U>.m_commandPool.
  super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device = (VkDevice)0x0;
  env.super_CommandBufferBareTestEnvironment<1U>.m_commandPool.
  super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&renderPassCreateInfo,pDVar11,pVVar10,2,dVar6,
             (VkAllocationCallbacks *)0x0);
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[2] = renderPassCreateInfo.flags;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[0] =
       renderPassCreateInfo.attachmentCount;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1] =
       (int)renderPassCreateInfo.pAttachments;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[2] =
       (int)((ulong)renderPassCreateInfo.pAttachments >> 0x20);
  pixelBufferAccess.super_ConstPixelBufferAccess.m_format.order = renderPassCreateInfo.sType;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_format.type = renderPassCreateInfo._4_4_;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data._0_8_ = renderPassCreateInfo.pNext;
  renderPassCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  renderPassCreateInfo._4_4_ = 0;
  renderPassCreateInfo.pNext = (void *)0x0;
  renderPassCreateInfo.flags = 0;
  renderPassCreateInfo.attachmentCount = 0;
  renderPassCreateInfo.pAttachments = (VkAttachmentDescription *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::reset
            (&env.super_CommandBufferBareTestEnvironment<1U>.m_commandPool.
              super_RefBase<vk::Handle<(vk::HandleType)24>_>);
  env.super_CommandBufferBareTestEnvironment<1U>.m_commandPool.
  super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)
       CONCAT44(pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[2],
                pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1]);
  env.super_CommandBufferBareTestEnvironment<1U>.m_commandPool.
  super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device =
       (VkDevice)pixelBufferAccess.super_ConstPixelBufferAccess._16_8_;
  env.super_CommandBufferBareTestEnvironment<1U>.m_commandPool.
  super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal._0_4_ =
       pixelBufferAccess.super_ConstPixelBufferAccess.m_format.order;
  env.super_CommandBufferBareTestEnvironment<1U>.m_commandPool.
  super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal._4_4_ =
       pixelBufferAccess.super_ConstPixelBufferAccess.m_format.type;
  env.super_CommandBufferBareTestEnvironment<1U>.m_commandPool.
  super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data._0_8_;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)24>_> *)&renderPassCreateInfo);
  pixelBufferAccess.super_ConstPixelBufferAccess.m_format.order = 0x28;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[2] =
       (undefined4)
       env.super_CommandBufferBareTestEnvironment<1U>.m_commandPool.
       super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[0] =
       env.super_CommandBufferBareTestEnvironment<1U>.m_commandPool.
       super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal._4_4_;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1] = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[2] = 1;
  VVar7 = (*(env.super_CommandBufferBareTestEnvironment<1U>.m_vkd)->_vptr_DeviceInterface[0x47])
                    (env.super_CommandBufferBareTestEnvironment<1U>.m_vkd,
                     env.super_CommandBufferBareTestEnvironment<1U>.m_device,
                     (VkSubpassDescription *)&pixelBufferAccess);
  ::vk::checkResult(VVar7,
                    "m_vkd.allocateCommandBuffers(m_device, &cmdBufferAllocateInfo, m_primaryCommandBuffers)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0x66);
  env.m_secondaryCommandBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object =
       (VkCommandBuffer_s *)0x0;
  env.m_secondaryCommandBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  env.m_secondaryCommandBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device =
       (VkDevice)0x0;
  env.m_secondaryCommandBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.
  m_internal = 0;
  memset(&env.m_colorImage,0,0x88);
  renderPassCreateInfo.pAttachments = (VkAttachmentDescription *)&copyRegion;
  copyRegion.bufferOffset._0_4_ = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  copyRegion.imageSubresource.aspectMask = 0;
  copyRegion.imageSubresource.layerCount = 0;
  copyRegion.bufferOffset._4_4_ = 0x29;
  copyRegion.bufferRowLength = 1;
  dVar6 = 1;
  copyRegion.imageSubresource.mipLevel = 2;
  copyRegion.imageSubresource.baseArrayLayer = 1;
  copyRegion.imageOffset.x = 2;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_data = &colorAttRef;
  colorAttRef.attachment = 0;
  colorAttRef.layout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[2] = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[0] = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[2] = 0;
  renderPassCreateInfo.sType = VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO;
  renderPassCreateInfo.pNext = (void *)0x0;
  renderPassCreateInfo.flags = 0;
  renderPassCreateInfo.attachmentCount = 1;
  renderPassCreateInfo.subpassCount = 1;
  renderPassCreateInfo._48_8_ = (ulong)(uint)renderPassCreateInfo._52_4_ << 0x20;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_format.order = R;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
  renderPassCreateInfo.pDependencies = (VkSubpassDependency *)0x0;
  copyRegion.bufferImageHeight = dVar6;
  renderPassCreateInfo.pSubpasses = (VkSubpassDescription *)&pixelBufferAccess;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1] = dVar6;
  ::vk::createRenderPass
            ((Move<vk::Handle<(vk::HandleType)17>_> *)local_c8,
             env.super_CommandBufferBareTestEnvironment<1U>.m_vkd,
             env.super_CommandBufferBareTestEnvironment<1U>.m_device,&renderPassCreateInfo,
             (VkAllocationCallbacks *)0x0);
  pVVar5 = pVStack_b0;
  pVVar10 = local_b8;
  pDVar11 = pDStack_c0;
  attachmentViews[0].m_internal = (VkImageView)(VkImageView)local_c8;
  local_c8._0_4_ = R;
  local_c8._4_4_ = SNORM_INT8;
  pDStack_c0 = (DeviceInterface *)0x0;
  local_b8 = (VkDevice)0x0;
  pVStack_b0 = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::reset
            (&env.m_renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>);
  env.m_renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device = pVVar10;
  env.m_renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator =
       pVVar5;
  env.m_renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal =
       (deUint64)attachmentViews[0].m_internal;
  env.m_renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface =
       pDVar11;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)17>_> *)local_c8);
  pixelBufferAccess.super_ConstPixelBufferAccess.m_format.order = sRGB;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[2] = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[0] = 1;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1] = 0x29;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[2] = 0xff;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_data._0_4_ = 0xff;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_data._4_4_ = dVar6;
  ::vk::createImage((Move<vk::Handle<(vk::HandleType)9>_> *)&copyRegion,
                    env.super_CommandBufferBareTestEnvironment<1U>.m_vkd,
                    env.super_CommandBufferBareTestEnvironment<1U>.m_device,
                    (VkImageCreateInfo *)&pixelBufferAccess,(VkAllocationCallbacks *)0x0);
  renderPassCreateInfo._4_4_ = copyRegion.bufferOffset._4_4_;
  renderPassCreateInfo.sType = (ChannelOrder)copyRegion.bufferOffset;
  renderPassCreateInfo.pNext =
       (void *)CONCAT44(copyRegion.bufferImageHeight,copyRegion.bufferRowLength);
  renderPassCreateInfo.attachmentCount = copyRegion.imageSubresource.mipLevel;
  renderPassCreateInfo.flags = copyRegion.imageSubresource.aspectMask;
  renderPassCreateInfo.pAttachments =
       (VkAttachmentDescription *)
       CONCAT44(copyRegion.imageSubresource.layerCount,copyRegion.imageSubresource.baseArrayLayer);
  copyRegion.bufferOffset._0_4_ = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  copyRegion.bufferOffset._4_4_ = 0;
  copyRegion.bufferRowLength = 0;
  copyRegion.bufferImageHeight = 0;
  copyRegion.imageSubresource.aspectMask = 0;
  copyRegion.imageSubresource.mipLevel = 0;
  copyRegion.imageSubresource.baseArrayLayer = 0;
  copyRegion.imageSubresource.layerCount = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::reset
            (&env.m_colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  env.m_colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       (VkDevice)renderPassCreateInfo._16_8_;
  env.m_colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)renderPassCreateInfo.pAttachments;
  env.m_colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal =
       renderPassCreateInfo._0_8_;
  env.m_colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)renderPassCreateInfo.pNext;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)9>_> *)&copyRegion);
  pAVar3 = env.super_CommandBufferBareTestEnvironment<1U>.m_allocator;
  ::vk::getImageMemoryRequirements
            ((VkMemoryRequirements *)&pixelBufferAccess,
             env.super_CommandBufferBareTestEnvironment<1U>.m_vkd,
             env.super_CommandBufferBareTestEnvironment<1U>.m_device,
             (VkImage)env.m_colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                      m_internal);
  (*pAVar3->_vptr_Allocator[3])(&renderPassCreateInfo,pAVar3,&pixelBufferAccess,0);
  renderPassCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  renderPassCreateInfo._4_4_ = 0;
  data._8_4_ = in_stack_fffffffffffffcc0;
  data.ptr = (Allocation *)in_stack_fffffffffffffcb8;
  data._12_4_ = in_stack_fffffffffffffcc4;
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::assignData
            (&env.m_colorImageMemory.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>,data);
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
             &renderPassCreateInfo);
  VVar7 = (*(env.super_CommandBufferBareTestEnvironment<1U>.m_vkd)->_vptr_DeviceInterface[0xd])
                    (env.super_CommandBufferBareTestEnvironment<1U>.m_vkd,
                     env.super_CommandBufferBareTestEnvironment<1U>.m_device,
                     env.m_colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                     m_internal,
                     ((env.m_colorImageMemory.
                       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                      ptr)->m_memory).m_internal);
  ::vk::checkResult(VVar7,
                    "m_vkd.bindImageMemory(m_device, *m_colorImage, m_colorImageMemory->getMemory(), m_colorImageMemory->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0xf0);
  pixelBufferAccess.super_ConstPixelBufferAccess.m_format.order = sRGBA;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess._16_8_ =
       pixelBufferAccess.super_ConstPixelBufferAccess._16_8_ & 0xffffffff00000000;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1] =
       (int)env.m_colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[2] =
       (int)(env.m_colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal
            >> 0x20);
  pixelBufferAccess.super_ConstPixelBufferAccess.m_data._0_4_ = 1;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_data._4_4_ = 0x29;
  ::vk::createImageView
            ((Move<vk::Handle<(vk::HandleType)13>_> *)&copyRegion,
             env.super_CommandBufferBareTestEnvironment<1U>.m_vkd,
             env.super_CommandBufferBareTestEnvironment<1U>.m_device,
             (VkImageViewCreateInfo *)&pixelBufferAccess,(VkAllocationCallbacks *)0x0);
  renderPassCreateInfo._4_4_ = copyRegion.bufferOffset._4_4_;
  renderPassCreateInfo.sType = (ChannelOrder)copyRegion.bufferOffset;
  renderPassCreateInfo.pNext =
       (void *)CONCAT44(copyRegion.bufferImageHeight,copyRegion.bufferRowLength);
  renderPassCreateInfo.attachmentCount = copyRegion.imageSubresource.mipLevel;
  renderPassCreateInfo.flags = copyRegion.imageSubresource.aspectMask;
  renderPassCreateInfo.pAttachments =
       (VkAttachmentDescription *)
       CONCAT44(copyRegion.imageSubresource.layerCount,copyRegion.imageSubresource.baseArrayLayer);
  copyRegion.bufferOffset._0_4_ = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  copyRegion.bufferOffset._4_4_ = 0;
  copyRegion.bufferRowLength = 0;
  copyRegion.bufferImageHeight = 0;
  copyRegion.imageSubresource.aspectMask = 0;
  copyRegion.imageSubresource.mipLevel = 0;
  copyRegion.imageSubresource.baseArrayLayer = 0;
  copyRegion.imageSubresource.layerCount = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::reset
            (&env.m_colorImageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>);
  env.m_colorImageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
       (VkDevice)renderPassCreateInfo._16_8_;
  env.m_colorImageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)renderPassCreateInfo.pAttachments;
  env.m_colorImageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal =
       renderPassCreateInfo._0_8_;
  env.m_colorImageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)renderPassCreateInfo.pNext;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)13>_> *)&copyRegion);
  pixelBufferAccess.super_ConstPixelBufferAccess.m_format.order = 0x25;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
  attachmentViews[0].m_internal =
       (VkImageView)
       (VkImageView)
       env.m_colorImageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
  pixelBufferAccess.super_ConstPixelBufferAccess._16_8_ =
       pixelBufferAccess.super_ConstPixelBufferAccess._16_8_ & 0xffffffff00000000;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1] =
       (int)env.m_renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal
  ;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[2] =
       (int)(env.m_renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
             m_internal >> 0x20);
  pixelBufferAccess.super_ConstPixelBufferAccess.m_data._0_4_ = dVar6;
  ::vk::createFramebuffer
            ((Move<vk::Handle<(vk::HandleType)23>_> *)&copyRegion,
             env.super_CommandBufferBareTestEnvironment<1U>.m_vkd,
             env.super_CommandBufferBareTestEnvironment<1U>.m_device,
             (VkFramebufferCreateInfo *)&pixelBufferAccess,(VkAllocationCallbacks *)0x0);
  renderPassCreateInfo._4_4_ = copyRegion.bufferOffset._4_4_;
  renderPassCreateInfo.sType = (ChannelOrder)copyRegion.bufferOffset;
  renderPassCreateInfo.pNext =
       (void *)CONCAT44(copyRegion.bufferImageHeight,copyRegion.bufferRowLength);
  renderPassCreateInfo.attachmentCount = copyRegion.imageSubresource.mipLevel;
  renderPassCreateInfo.flags = copyRegion.imageSubresource.aspectMask;
  renderPassCreateInfo.pAttachments =
       (VkAttachmentDescription *)
       CONCAT44(copyRegion.imageSubresource.layerCount,copyRegion.imageSubresource.baseArrayLayer);
  copyRegion.bufferOffset._0_4_ = R;
  copyRegion.bufferOffset._4_4_ = SNORM_INT8;
  copyRegion.bufferRowLength = 0;
  copyRegion.bufferImageHeight = 0;
  copyRegion.imageSubresource.aspectMask = 0;
  copyRegion.imageSubresource.mipLevel = 0;
  copyRegion.imageSubresource.baseArrayLayer = 0;
  copyRegion.imageSubresource.layerCount = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::reset
            (&env.m_frameBuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>);
  env.m_frameBuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device =
       (VkDevice)renderPassCreateInfo._16_8_;
  env.m_frameBuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)renderPassCreateInfo.pAttachments;
  env.m_frameBuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal =
       renderPassCreateInfo._0_8_;
  env.m_frameBuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)renderPassCreateInfo.pNext;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)23>_> *)&copyRegion);
  renderPassCreateInfo.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO;
  renderPassCreateInfo.pNext = (void *)0x0;
  renderPassCreateInfo.flags =
       (undefined4)
       env.super_CommandBufferBareTestEnvironment<1U>.m_commandPool.
       super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
  renderPassCreateInfo.attachmentCount =
       env.super_CommandBufferBareTestEnvironment<1U>.m_commandPool.
       super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal._4_4_;
  renderPassCreateInfo.pAttachments = (VkAttachmentDescription *)0x100000001;
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&copyRegion,
             env.super_CommandBufferBareTestEnvironment<1U>.m_vkd,
             env.super_CommandBufferBareTestEnvironment<1U>.m_device,
             (VkCommandBufferAllocateInfo *)&renderPassCreateInfo);
  pixelBufferAccess.super_ConstPixelBufferAccess.m_format.type = copyRegion.bufferOffset._4_4_;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_format.order =
       (ChannelOrder)copyRegion.bufferOffset;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[1] = copyRegion.bufferImageHeight;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[0] = copyRegion.bufferRowLength;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[0] =
       copyRegion.imageSubresource.mipLevel;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[2] =
       copyRegion.imageSubresource.aspectMask;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1] =
       copyRegion.imageSubresource.baseArrayLayer;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[2] =
       copyRegion.imageSubresource.layerCount;
  copyRegion.bufferOffset._0_4_ = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  copyRegion.bufferOffset._4_4_ = 0;
  copyRegion.bufferRowLength = 0;
  copyRegion.bufferImageHeight = 0;
  copyRegion.imageSubresource.aspectMask = 0;
  copyRegion.imageSubresource.mipLevel = 0;
  copyRegion.imageSubresource.baseArrayLayer = 0;
  copyRegion.imageSubresource.layerCount = 0;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::reset
            (&env.m_secondaryCommandBuffer.super_RefBase<vk::VkCommandBuffer_s_*>);
  env.m_secondaryCommandBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.
  m_internal = CONCAT44(pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[2],
                        pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1]);
  env.m_secondaryCommandBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device =
       (VkDevice)pixelBufferAccess.super_ConstPixelBufferAccess._16_8_;
  env.m_secondaryCommandBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object =
       (VkCommandBuffer_s *)pixelBufferAccess.super_ConstPixelBufferAccess.m_format;
  env.m_secondaryCommandBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data._0_8_;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            ((RefBase<vk::VkCommandBuffer_s_*> *)&copyRegion);
  apVVar4[0] = env.super_CommandBufferBareTestEnvironment<1U>.m_primaryCommandBuffers[0];
  secondaryCommandBuffer =
       env.m_secondaryCommandBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object;
  clearAttachment.aspectMask = 1;
  clearAttachment.colorAttachment = 0;
  clearAttachment.clearValue._0_4_ = 2.8026e-45;
  clearAttachment.clearValue._4_4_ = 0x2f;
  clearAttachment.clearValue._8_8_ = 0xd300000083;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_format.order = 0x29;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[2] =
       (undefined4)
       env.m_renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[0] =
       env.m_renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal.
       _4_4_;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1] = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_data._0_4_ =
       (deUint32)
       env.m_frameBuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_data._4_4_ =
       (deUint32)
       (env.m_frameBuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal >>
       0x20);
  renderPassCreateInfo.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO;
  renderPassCreateInfo.pNext = (void *)0x0;
  renderPassCreateInfo.flags = 2;
  renderPassCreateInfo.pAttachments = (VkAttachmentDescription *)&pixelBufferAccess;
  VVar7 = (*(env.super_CommandBufferBareTestEnvironment<1U>.m_vkd)->_vptr_DeviceInterface[0x49])
                    (env.super_CommandBufferBareTestEnvironment<1U>.m_vkd,
                     env.m_secondaryCommandBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.
                     object,&renderPassCreateInfo);
  ::vk::checkResult(VVar7,
                    "m_vkd.beginCommandBuffer(*m_secondaryCommandBuffer, &commandBufferBeginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0x16c);
  (*pDVar9->_vptr_DeviceInterface[0x68])(pDVar9,secondaryCommandBuffer,1,&clearAttachment,1);
  VVar7 = (*pDVar9->_vptr_DeviceInterface[0x4a])(pDVar9,secondaryCommandBuffer);
  VVar14 = 0x970897;
  ::vk::checkResult(VVar7,"vkd.endCommandBuffer(secondaryCommandBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0x872);
  CommandBufferRenderPassTestEnvironment::beginPrimaryCommandBuffer(&env,VVar14);
  renderPassCreateInfo.sType = VK_STRUCTURE_TYPE_PIPELINE_CACHE_CREATE_INFO;
  renderPassCreateInfo._4_4_ = 0x3b;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_format.order = 0x2b;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
  renderPassCreateInfo.pNext = (void *)0xfb000000a3;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[2] =
       (undefined4)
       env.m_renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[0] =
       env.m_renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal.
       _4_4_;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1] =
       (int)env.m_frameBuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.
            m_internal;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[2] =
       (int)(env.m_frameBuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.
             m_internal >> 0x20);
  pixelBufferAccess.super_ConstPixelBufferAccess.m_data._0_4_ = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_data._4_4_ = 0;
  (*(env.super_CommandBufferBareTestEnvironment<1U>.m_vkd)->_vptr_DeviceInterface[0x74])
            (env.super_CommandBufferBareTestEnvironment<1U>.m_vkd,
             env.super_CommandBufferBareTestEnvironment<1U>.m_primaryCommandBuffers[0],
             &pixelBufferAccess,1);
  (*pDVar9->_vptr_DeviceInterface[0x77])(pDVar9,apVVar4[0],1,&secondaryCommandBuffer);
  (*pDVar9->_vptr_DeviceInterface[0x76])(pDVar9,apVVar4[0]);
  VVar7 = (*pDVar9->_vptr_DeviceInterface[0x4a])(pDVar9,apVVar4[0]);
  ::vk::checkResult(VVar7,"vkd.endCommandBuffer(primaryCommandBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0x87a);
  CommandBufferRenderPassTestEnvironment::submitPrimaryCommandBuffer(&env);
  colorAttRef.attachment = 0;
  colorAttRef.layout = VK_IMAGE_LAYOUT_UNDEFINED;
  bufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
       (Allocation *)0x0;
  tcuFormat = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UINT);
  iVar8 = tcu::TextureFormat::getPixelSize(&tcuFormat);
  this = (TextureLevel *)operator_new(0x28);
  tcu::TextureLevel::TextureLevel(this,&tcuFormat,0xff,0xff,1);
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1] = iVar8 * 0xfe01;
  size = (ulong)(uint)pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1];
  pixelBufferAccess.super_ConstPixelBufferAccess.m_format.order = sR;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess._16_8_ =
       pixelBufferAccess.super_ConstPixelBufferAccess._16_8_ & 0xffffffff00000000;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[2] = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_data._0_4_ = 2;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_data._4_4_ = 0;
  result.super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.m_data.ptr =
       this;
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&copyRegion,
                     env.super_CommandBufferBareTestEnvironment<1U>.m_vkd,
                     env.super_CommandBufferBareTestEnvironment<1U>.m_device,
                     (VkBufferCreateInfo *)&pixelBufferAccess,(VkAllocationCallbacks *)0x0);
  renderPassCreateInfo._4_4_ = copyRegion.bufferOffset._4_4_;
  renderPassCreateInfo.sType = (ChannelOrder)copyRegion.bufferOffset;
  renderPassCreateInfo.pNext =
       (void *)CONCAT44(copyRegion.bufferImageHeight,copyRegion.bufferRowLength);
  renderPassCreateInfo.attachmentCount = copyRegion.imageSubresource.mipLevel;
  renderPassCreateInfo.flags = copyRegion.imageSubresource.aspectMask;
  renderPassCreateInfo.pAttachments =
       (VkAttachmentDescription *)
       CONCAT44(copyRegion.imageSubresource.layerCount,copyRegion.imageSubresource.baseArrayLayer);
  copyRegion.bufferOffset._0_4_ = 0;
  copyRegion.bufferOffset._4_4_ = 0;
  copyRegion.bufferRowLength = 0;
  copyRegion.bufferImageHeight = 0;
  copyRegion.imageSubresource.aspectMask = 0;
  copyRegion.imageSubresource.mipLevel = 0;
  copyRegion.imageSubresource.baseArrayLayer = 0;
  copyRegion.imageSubresource.layerCount = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::reset
            ((RefBase<vk::Handle<(vk::HandleType)8>_> *)&colorAttRef);
  colorAttRef.attachment = renderPassCreateInfo.sType;
  colorAttRef.layout = renderPassCreateInfo._4_4_;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)8>_> *)&copyRegion);
  pAVar3 = env.super_CommandBufferBareTestEnvironment<1U>.m_allocator;
  ::vk::getBufferMemoryRequirements
            ((VkMemoryRequirements *)&renderPassCreateInfo,
             env.super_CommandBufferBareTestEnvironment<1U>.m_vkd,
             env.super_CommandBufferBareTestEnvironment<1U>.m_device,(VkBuffer)colorAttRef);
  (*pAVar3->_vptr_Allocator[3])(&copyRegion,pAVar3,&renderPassCreateInfo,1);
  copyRegion.bufferOffset._0_4_ = 0;
  copyRegion.bufferOffset._4_4_ = 0;
  data_00._8_4_ = in_stack_fffffffffffffcc0;
  data_00.ptr = (Allocation *)in_stack_fffffffffffffcb8;
  data_00._12_4_ = in_stack_fffffffffffffcc4;
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::assignData
            (&bufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>,
             data_00);
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&copyRegion);
  VVar7 = (*(env.super_CommandBufferBareTestEnvironment<1U>.m_vkd)->_vptr_DeviceInterface[0xc])
                    (env.super_CommandBufferBareTestEnvironment<1U>.m_vkd,
                     env.super_CommandBufferBareTestEnvironment<1U>.m_device,colorAttRef,
                     ((bufferAlloc.
                       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                      ptr)->m_memory).m_internal,
                     (bufferAlloc.
                      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                     ptr)->m_offset);
  VVar14 = 0x970afb;
  ::vk::checkResult(VVar7,
                    "m_vkd.bindBufferMemory(m_device, *buffer, bufferAlloc->getMemory(), bufferAlloc->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0x19e);
  pixelBufferAccess.super_ConstPixelBufferAccess.m_format.order = 0x2d;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_size.m_data[2] = 0x100;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[0] = 0x800;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1] = 2;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_pitch.m_data[2] = 6;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_data._0_4_ = 0xffffffff;
  pixelBufferAccess.super_ConstPixelBufferAccess.m_data._4_4_ = 0xffffffff;
  renderPassCreateInfo.sType = VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER;
  renderPassCreateInfo.pNext = (void *)0x0;
  renderPassCreateInfo.flags = 0x1000;
  renderPassCreateInfo.attachmentCount = 0x2000;
  renderPassCreateInfo.pAttachments = (VkAttachmentDescription *)0xffffffffffffffff;
  renderPassCreateInfo.subpassCount = colorAttRef.attachment;
  renderPassCreateInfo._36_4_ = colorAttRef.layout;
  renderPassCreateInfo.pSubpasses = (VkSubpassDescription *)0x0;
  copyRegion.imageExtent.height = 0xff;
  copyRegion.imageExtent.depth = 1;
  copyRegion.imageOffset.x = 0;
  copyRegion.imageOffset.y = 0;
  copyRegion.imageOffset.z = 0;
  copyRegion.imageExtent.width = 0xff;
  copyRegion.imageSubresource.aspectMask = 1;
  copyRegion.imageSubresource.mipLevel = 0;
  copyRegion.imageSubresource.baseArrayLayer = 0;
  copyRegion.imageSubresource.layerCount = 1;
  copyRegion.bufferOffset._0_4_ = 0;
  copyRegion.bufferOffset._4_4_ = 0;
  copyRegion.bufferRowLength = 0xff;
  copyRegion.bufferImageHeight = 0xff;
  renderPassCreateInfo._48_8_ = size;
  CommandBufferRenderPassTestEnvironment::beginPrimaryCommandBuffer(&env,VVar14);
  (*(env.super_CommandBufferBareTestEnvironment<1U>.m_vkd)->_vptr_DeviceInterface[0x6d])
            (env.super_CommandBufferBareTestEnvironment<1U>.m_vkd,
             env.super_CommandBufferBareTestEnvironment<1U>.m_primaryCommandBuffers[0],0x400,0x1000,
             0,0,0,0,0,1,(VkBufferCreateInfo *)&pixelBufferAccess);
  (*(env.super_CommandBufferBareTestEnvironment<1U>.m_vkd)->_vptr_DeviceInterface[99])
            (env.super_CommandBufferBareTestEnvironment<1U>.m_vkd,
             env.super_CommandBufferBareTestEnvironment<1U>.m_primaryCommandBuffers[0],
             env.m_colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal
             ,6,colorAttRef,1,&copyRegion);
  (*(env.super_CommandBufferBareTestEnvironment<1U>.m_vkd)->_vptr_DeviceInterface[0x6d])
            (env.super_CommandBufferBareTestEnvironment<1U>.m_vkd,
             env.super_CommandBufferBareTestEnvironment<1U>.m_primaryCommandBuffers[0],0x1000,1,0,0,
             0,1,&renderPassCreateInfo,0,0);
  VVar7 = (*(env.super_CommandBufferBareTestEnvironment<1U>.m_vkd)->_vptr_DeviceInterface[0x4a])
                    (env.super_CommandBufferBareTestEnvironment<1U>.m_vkd,
                     env.super_CommandBufferBareTestEnvironment<1U>.m_primaryCommandBuffers[0]);
  ::vk::checkResult(VVar7,"m_vkd.endCommandBuffer(m_primaryCommandBuffers[0])",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0x1d4);
  CommandBufferRenderPassTestEnvironment::submitPrimaryCommandBuffer(&env);
  ::vk::invalidateMappedMemoryRange
            (env.super_CommandBufferBareTestEnvironment<1U>.m_vkd,
             env.super_CommandBufferBareTestEnvironment<1U>.m_device,
             (VkDeviceMemory)
             ((bufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
               m_data.ptr)->m_memory).m_internal,
             (bufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
              m_data.ptr)->m_offset,size);
  tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)attachmentViews,this);
  local_38 = this->m_format;
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            ((ConstPixelBufferAccess *)local_c8,&local_38,&this->m_size,
             (bufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
              m_data.ptr)->m_hostPtr);
  tcu::copy((EVP_PKEY_CTX *)attachmentViews,(EVP_PKEY_CTX *)local_c8);
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            (&bufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)8>_> *)&colorAttRef);
  tcu::TextureLevel::getAccess
            (&pixelBufferAccess,
             result.super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.
             m_data.ptr);
  pbVar12 = (byte *)CONCAT44(pixelBufferAccess.super_ConstPixelBufferAccess.m_data._4_4_,
                             (deUint32)pixelBufferAccess.super_ConstPixelBufferAccess.m_data);
  lVar13 = 0;
  do {
    if (lVar13 == 0xfe01) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&renderPassCreateInfo,"render pass continue test passed",
                 (allocator<char> *)&copyRegion);
      tcu::TestStatus::pass(__return_storage_ptr__,(string *)&renderPassCreateInfo);
LAB_004ae883:
      std::__cxx11::string::~string((string *)&renderPassCreateInfo);
      de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::
      ~UniqueBase(&result.
                   super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>);
      CommandBufferRenderPassTestEnvironment::~CommandBufferRenderPassTestEnvironment(&env);
      return __return_storage_ptr__;
    }
    pbVar15 = pbVar12;
    lVar16 = 0;
    while (lVar16 != 0x10) {
      bVar2 = *pbVar15;
      pbVar15 = pbVar15 + 1;
      puVar1 = (uint *)((long)&DAT_0096fb40 + lVar16);
      lVar16 = lVar16 + 4;
      if (*puVar1 != (uint)bVar2) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&renderPassCreateInfo,"clear value mismatch",
                   (allocator<char> *)&copyRegion);
        tcu::TestStatus::fail(__return_storage_ptr__,(string *)&renderPassCreateInfo);
        goto LAB_004ae883;
      }
    }
    lVar13 = lVar13 + 1;
    pbVar12 = pbVar12 + 4;
  } while( true );
}

Assistant:

tcu::TestStatus renderPassContinueTest(Context& context)
{
	const DeviceInterface&					vkd						= context.getDeviceInterface();
	CommandBufferRenderPassTestEnvironment	env						(context, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT);

	VkCommandBuffer							primaryCommandBuffer	= env.getPrimaryCommandBuffer();
	VkCommandBuffer							secondaryCommandBuffer	= env.getSecondaryCommandBuffer();
	const deUint32							clearColor[4]			= { 2, 47, 131, 211 };

	const VkClearAttachment					clearAttachment			=
	{
		VK_IMAGE_ASPECT_COLOR_BIT,									// VkImageAspectFlags	aspectMask;
		0,															// deUint32				colorAttachment;
		makeClearValueColorU32(clearColor[0],
							   clearColor[1],
							   clearColor[2],
							   clearColor[3])						// VkClearValue			clearValue;
	};

	const VkClearRect						clearRect				=
	{
		CommandBufferRenderPassTestEnvironment::DEFAULT_IMAGE_AREA,	// VkRect2D	rect;
		0u,															// deUint32	baseArrayLayer;
		1u															// deUint32	layerCount;
	};

	env.beginSecondaryCommandBuffer(VK_COMMAND_BUFFER_USAGE_RENDER_PASS_CONTINUE_BIT);
	vkd.cmdClearAttachments(secondaryCommandBuffer, 1, &clearAttachment, 1, &clearRect);
	VK_CHECK(vkd.endCommandBuffer(secondaryCommandBuffer));


	env.beginPrimaryCommandBuffer(0);
	env.beginRenderPass(VK_SUBPASS_CONTENTS_SECONDARY_COMMAND_BUFFERS);
	vkd.cmdExecuteCommands(primaryCommandBuffer, 1, &secondaryCommandBuffer);
	vkd.cmdEndRenderPass(primaryCommandBuffer);

	VK_CHECK(vkd.endCommandBuffer(primaryCommandBuffer));

	env.submitPrimaryCommandBuffer();

	de::MovePtr<tcu::TextureLevel>			result					= env.readColorAttachment();
	tcu::PixelBufferAccess					pixelBufferAccess		= result->getAccess();

	for (deUint32 i = 0; i < (CommandBufferRenderPassTestEnvironment::DEFAULT_IMAGE_SIZE.width * CommandBufferRenderPassTestEnvironment::DEFAULT_IMAGE_SIZE.height); ++i)
	{
		deUint8* colorData = reinterpret_cast<deUint8*>(pixelBufferAccess.getDataPtr());
		for (int colorComponent = 0; colorComponent < 4; ++colorComponent)
			if (colorData[i * 4 + colorComponent] != clearColor[colorComponent])
				return tcu::TestStatus::fail("clear value mismatch");
	}

	return tcu::TestStatus::pass("render pass continue test passed");
}